

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void sznet::net::defaultConnectionCallback(TcpConnectionPtr *conn)

{
  bool bVar1;
  LogLevel LVar2;
  LogStream *this;
  element_type *peVar3;
  self *psVar4;
  char *str;
  SourceFile file;
  InetAddress local_1040;
  InetAddress local_1020;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_10
  ;
  TcpConnectionPtr *conn_local;
  
  local_10 = (__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)conn;
  LVar2 = Logger::logLevel();
  if ((int)LVar2 < 1) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_ff0,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x13,TRACE,"defaultConnectionCallback");
    this = Logger::stream(&local_fe0);
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_10);
    TcpConnection::localAddress(peVar3);
    InetAddress::toIpPort_abi_cxx11_(&local_1020);
    psVar4 = LogStream::operator<<(this,(string *)&local_1020);
    psVar4 = LogStream::operator<<(psVar4," -> ");
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_10);
    TcpConnection::peerAddress(peVar3);
    InetAddress::toIpPort_abi_cxx11_(&local_1040);
    psVar4 = LogStream::operator<<(psVar4,(string *)&local_1040);
    psVar4 = LogStream::operator<<(psVar4," is ");
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_10);
    bVar1 = TcpConnection::connected(peVar3);
    str = "DOWN";
    if (bVar1) {
      str = "UP";
    }
    LogStream::operator<<(psVar4,str);
    std::__cxx11::string::~string((string *)&local_1040);
    std::__cxx11::string::~string((string *)&local_1020);
    Logger::~Logger(&local_fe0);
  }
  return;
}

Assistant:

void defaultConnectionCallback(const TcpConnectionPtr& conn)
{
	LOG_TRACE << conn->localAddress().toIpPort() << " -> "
		<< conn->peerAddress().toIpPort() << " is "
		<< (conn->connected() ? "UP" : "DOWN");
	// do not call conn->forceClose(), because some users want to register message callback only.
}